

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# createdfd.c
# Opt level: O1

void writeSample(uint32_t *DFD,int sampleNo,int channel,int bits,int offset,int topSample,
                int bottomSample,VkSuffix suffix)

{
  uint32_t uVar1;
  uint uVar2;
  byte bVar3;
  uint uVar4;
  long lVar5;
  
  lVar5 = (long)(sampleNo << 2);
  uVar1 = 0xf;
  if (channel != 3) {
    uVar1 = channel;
  }
  uVar1 = setChannelFlags(uVar1,suffix);
  DFD[lVar5 + 7] = uVar1 << 0x18 | (bits + -1) * 0x10000 | offset;
  DFD[lVar5 + 8] = 0;
  uVar2 = 0x3f800000;
  uVar4 = 0x3f800000;
  switch(suffix) {
  case s_SNORM:
    bVar3 = (byte)(bits + -1);
    if (topSample == 0) {
      bVar3 = (byte)bits;
    }
    uVar2 = 0x7fffffff;
    if (bits < 0x21) {
      uVar2 = ~(-1 << (bVar3 & 0x1f));
    }
    uVar4 = -uVar2;
    if (bottomSample == 0) {
      uVar4 = ~uVar2;
    }
    break;
  case s_USCALED:
  case s_UINT:
    uVar4 = (uint)(bottomSample != 0);
  case s_UFLOAT:
switchD_001ce0e3_caseD_7:
    uVar2 = uVar4;
    uVar4 = 0;
    break;
  case s_SSCALED:
  case s_SINT:
    uVar2 = (uint)(bottomSample != 0);
    uVar4 = 0xffffffff;
    break;
  case s_SFLOAT:
    uVar4 = 0xbf800000;
    break;
  default:
    uVar4 = ~(-1 << ((byte)bits & 0x1f));
    if (0x20 < bits) {
      uVar4 = 0xffffffff;
    }
    goto switchD_001ce0e3_caseD_7;
  case s_SFIXED5:
    if (bits != 0x10) {
      __assert_fail("bits == 16 && \"Format with this suffix must be 16 bits per channel.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/dfdutils/createdfd.c"
                    ,0xa6,
                    "void writeSample(uint32_t *, int, int, int, int, int, int, enum VkSuffix)");
    }
    uVar2 = 0x20;
    uVar4 = 0xffffffe0;
  }
  DFD[lVar5 + 9] = uVar4;
  DFD[lVar5 + 10] = uVar2;
  return;
}

Assistant:

static void writeSample(uint32_t *DFD, int sampleNo, int channel,
                        int bits, int offset,
                        int topSample, int bottomSample, enum VkSuffix suffix)
{
    // Use this to avoid type-punning complaints from the gcc optimizer
    // with -Wall.
    union {
        uint32_t i;
        float f;
    } lower, upper;
    uint32_t *sample = DFD + 1 + KHR_DF_WORD_SAMPLESTART + sampleNo * KHR_DF_WORD_SAMPLEWORDS;

    if (channel == 3) channel = KHR_DF_CHANNEL_RGBSDA_ALPHA;
    channel = setChannelFlags(channel, suffix);

    sample[KHR_DF_SAMPLEWORD_BITOFFSET] =
        (offset << KHR_DF_SAMPLESHIFT_BITOFFSET) |
        ((bits - 1) << KHR_DF_SAMPLESHIFT_BITLENGTH) |
        (channel << KHR_DF_SAMPLESHIFT_CHANNELID);

    sample[KHR_DF_SAMPLEWORD_SAMPLEPOSITION_ALL] = 0;

    switch (suffix) {
    case s_UNORM:
    case s_SRGB:
    default:
        if (bits > 32) {
            upper.i = 0xFFFFFFFFU;
        } else {
            upper.i = (uint32_t)((1U << bits) - 1U);
        }
        lower.i = 0U;
        break;
    case s_SNORM:
        if (bits > 32) {
            upper.i = 0x7FFFFFFF;
        } else {
            upper.i = topSample ? (1U << (bits - 1)) - 1 : (1U << bits) - 1;
        }
        lower.i = ~upper.i;
        if (bottomSample) lower.i += 1;
        break;
    case s_USCALED:
    case s_UINT:
        upper.i = bottomSample ? 1U : 0U;
        lower.i = 0U;
        break;
    case s_SSCALED:
    case s_SINT:
        upper.i = bottomSample ? 1U : 0U;
        lower.i = ~0U;
        break;
    case s_SFLOAT:
        upper.f = 1.0f;
        lower.f = -1.0f;
        break;
    case s_UFLOAT:
        upper.f = 1.0f;
        lower.f = 0.0f;
        break;
    case s_SFIXED5:
        assert(bits == 16 && "Format with this suffix must be 16 bits per channel.");
        upper.i = 32;
        lower.i = ~upper.i + 1; // -32
    }
    sample[KHR_DF_SAMPLEWORD_SAMPLELOWER] = lower.i;
    sample[KHR_DF_SAMPLEWORD_SAMPLEUPPER] = upper.i;
}